

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O0

Cnf_Dat_t * Cnf_DeriveFast(Aig_Man_t *p,int nOutputs)

{
  Cnf_Dat_t *pCVar1;
  abctime clk;
  Cnf_Dat_t *pCnf;
  int nOutputs_local;
  Aig_Man_t *p_local;
  
  Aig_ManCleanMarkAB(p);
  Abc_Clock();
  Cnf_DeriveFastMark(p);
  Abc_Clock();
  pCVar1 = Cnf_DeriveFastClauses(p,nOutputs);
  Aig_ManCleanMarkA(p);
  return pCVar1;
}

Assistant:

Cnf_Dat_t * Cnf_DeriveFast( Aig_Man_t * p, int nOutputs )
{
    Cnf_Dat_t * pCnf = NULL;
    abctime clk;//, clkTotal = Abc_Clock();
//    printf( "\n" );
    Aig_ManCleanMarkAB( p );
    // create initial marking
    clk = Abc_Clock();
    Cnf_DeriveFastMark( p );
//    Abc_PrintTime( 1, "Marking", Abc_Clock() - clk );
    // compute CNF size
    clk = Abc_Clock();
    pCnf = Cnf_DeriveFastClauses( p, nOutputs );
//    Abc_PrintTime( 1, "Clauses", Abc_Clock() - clk );
    // derive the resulting CNF
    Aig_ManCleanMarkA( p );
//    Abc_PrintTime( 1, "TOTAL  ", Abc_Clock() - clkTotal );

//    printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d.   \n", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );

//    Cnf_DataFree( pCnf );
//    pCnf = NULL;
    return pCnf;
}